

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,_std::error_code> *
__thiscall
pstore::json::details::string_matcher<pstore::json::null_output>::consume_normal_state
          (tuple<pstore::json::details::string_matcher<pstore::json::null_output>::state,_std::error_code>
           *__return_storage_ptr__,string_matcher<pstore::json::null_output> *this,
          parser<pstore::json::null_output> *parser,char32_t code_point,appender *app)

{
  state sVar1;
  error_category *peVar2;
  state sVar3;
  int iVar4;
  
  iVar4 = 0;
  peVar2 = (error_category *)std::_V2::system_category();
  if (code_point == L'\\') {
    sVar3 = escape_state;
  }
  else {
    if (code_point == L'\"') {
      sVar3 = done_state;
      sVar1 = done_state;
      if (app->high_surrogate_ == L'\0') goto LAB_0016297b;
    }
    else {
      if ((0x1f < (uint)code_point) && (app->high_surrogate_ == L'\0')) {
        utf::code_point_to_utf8<char,std::back_insert_iterator<std::__cxx11::string>>
                  (code_point,(app->result_).ptr_);
        sVar3 = normal_char_state;
        goto LAB_0016297b;
      }
      sVar1 = normal_char_state;
    }
    sVar3 = sVar1;
    iVar4 = 0xd;
    peVar2 = get_error_category();
  }
LAB_0016297b:
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::json::null_output>::state,_std::error_code>
  ).super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
  _M_head_impl._M_value = iVar4;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::json::null_output>::state,_std::error_code>
  ).super__Tuple_impl<1UL,_std::error_code>.super__Head_base<1UL,_std::error_code,_false>.
  _M_head_impl._M_cat = peVar2;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_pstore::json::details::string_matcher<pstore::json::null_output>::state,_std::error_code>
  ).
  super__Head_base<0UL,_pstore::json::details::string_matcher<pstore::json::null_output>::state,_false>
  ._M_head_impl = sVar3;
  return __return_storage_ptr__;
}

Assistant:

auto string_matcher<Callbacks>::consume_normal_state (parser<Callbacks> & parser,
                                                                  char32_t code_point,
                                                                  appender & app)
                -> std::tuple<state, std::error_code> {
                state next_state = normal_char_state;
                std::error_code error;

                if (code_point == '"') {
                    if (app.has_high_surrogate ()) {
                        error = error_code::bad_unicode_code_point;
                    } else {
                        // Consume the closing quote character.
                        if (object_key_) {
                            error = parser.callbacks ().key (*app.result ());
                        } else {
                            error = parser.callbacks ().string_value (*app.result ());
                        }
                    }
                    next_state = done_state;
                } else if (code_point == '\\') {
                    next_state = escape_state;
                } else if (code_point <= 0x1F) {
                    // Control characters U+0000 through U+001F MUST be escaped.
                    error = error_code::bad_unicode_code_point;
                } else {
                    if (!app.append32 (code_point)) {
                        error = error_code::bad_unicode_code_point;
                    }
                }

                return std::make_tuple (next_state, error);
            }